

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

double extract_spR<PredictionData<float,int>,int>
                 (PredictionData<float,_int> *prediction_data,int *row_st,int *row_end,
                 size_t col_num,size_t lb,size_t ub)

{
  int *piVar1;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int *search_res;
  int *in_stack_ffffffffffffffc0;
  undefined4 local_28;
  undefined8 local_8;
  
  if (((in_RDX == in_RSI) || (in_RCX < in_R8)) || (in_R9 < in_RCX)) {
    local_8 = 0.0;
  }
  else {
    local_28 = (int)in_RCX;
    piVar1 = std::lower_bound<int_const*,int>(in_R8,in_R9,in_stack_ffffffffffffffc0);
    if ((piVar1 == in_RDX) || (*piVar1 != local_28)) {
      local_8 = 0.0;
    }
    else {
      local_8 = (double)*(float *)(*(long *)(in_RDI + 0x48) +
                                  ((long)piVar1 - *(long *)(in_RDI + 0x50) >> 2) * 4);
    }
  }
  return local_8;
}

Assistant:

static inline double extract_spR(const PredictionData &prediction_data,
                                 const sparse_ix *row_st, const sparse_ix *row_end,
                                 size_t col_num, size_t lb, size_t ub) noexcept
{
    if (row_end == row_st || col_num < lb || col_num > ub)
        return 0.;
    const sparse_ix *search_res = std::lower_bound(row_st, row_end, (sparse_ix) col_num);
    if (search_res == row_end || *search_res != (sparse_ix)col_num)
        return 0.;
    else
        return prediction_data.Xr[search_res - prediction_data.Xr_ind];
}